

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

void envy_bios_print_power_fan(envy_bios *bios,FILE *out,uint mask)

{
  uint8_t uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  
  uVar2 = (bios->power).fan.offset;
  if ((mask >> 10 & 1) == 0 || uVar2 == 0) {
    return;
  }
  uVar3 = (ulong)(bios->power).fan.version;
  if ((bios->power).fan.valid != '\0') {
    fprintf((FILE *)out,"FAN table at 0x%x, version %x\n",(ulong)uVar2,uVar3);
    envy_bios_dump_hex(bios,out,(bios->power).fan.offset,(uint)(bios->power).fan.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    uVar1 = (bios->power).fan.type;
    pcVar5 = "UNKNOWN";
    if (uVar1 == '\x01') {
      pcVar5 = "PWM";
    }
    pcVar4 = "TOGGLE";
    if (uVar1 != '\0') {
      pcVar4 = pcVar5;
    }
    fprintf((FILE *)out,"-- type: %s, duty_range: [%u:%u]%%, fan_div: %u --\n",pcVar4,
            (ulong)(bios->power).fan.duty_min,(ulong)(bios->power).fan.duty_max,
            (ulong)(bios->power).fan.divisor);
    fprintf((FILE *)out,"-- unk0e: %u, unk10: %u, unboost delay: %u ms, boosted_duty: %u%% --\n",
            (ulong)(bios->power).fan.unk0e,(ulong)(bios->power).fan.unk10,
            (ulong)(bios->power).fan.unboost_unboost_ms,(ulong)(bios->power).fan.duty_boosted);
    envy_bios_dump_hex(bios,out,(uint)(bios->power).fan.hlen + (bios->power).fan.offset,
                       (uint)(bios->power).fan.rlen,mask);
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse FAN table at 0x%x, version %x\n",(ulong)uVar2,uVar3);
  return;
}

Assistant:

void envy_bios_print_power_fan(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_fan *fan = &bios->power.fan;
	const char *fan_type_s = "UNKNOWN";

	if (!fan->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!fan->valid) {
		fprintf(out, "Failed to parse FAN table at 0x%x, version %x\n", fan->offset, fan->version);
		return;
	}

	fprintf(out, "FAN table at 0x%x, version %x\n", fan->offset, fan->version);
	envy_bios_dump_hex(bios, out, fan->offset, fan->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	if (fan->type == 0)
		fan_type_s = "TOGGLE";
	else if (fan->type == 1)
		fan_type_s = "PWM";

	fprintf(out, "-- type: %s, duty_range: [%u:%u]%%, fan_div: %u --\n",
		fan_type_s, fan->duty_min, fan->duty_max, fan->divisor);
	fprintf(out, "-- unk0e: %u, unk10: %u, unboost delay: %u ms, boosted_duty: %u%% --\n",
		fan->unk0e, fan->unk10, fan->unboost_unboost_ms, fan->duty_boosted);

	/* fan boost threshold is set to 96°C but seems to be hardcoded */

	envy_bios_dump_hex(bios, out, fan->offset + fan->hlen, fan->rlen, mask);
	fprintf(out, "\n");
}